

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_meta.c
# Opt level: O1

TValue * lj_meta_comp(lua_State *L,cTValue *o1,cTValue *o2,int op)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint uVar3;
  int iVar4;
  TValue *in_RAX;
  cTValue *pcVar5;
  cTValue *o1_00;
  cTValue *o2_00;
  TValue *pTVar6;
  uint uVar7;
  ulong uVar8;
  TValue *pTVar9;
  code *pcVar10;
  MMS mm;
  TValue *local_38;
  
  pTVar9 = (TValue *)(ulong)(uint)op;
  uVar1 = (o1->field_2).it;
  pcVar5 = o1;
  if ((uVar1 == 0xfffffff5) || (uVar2 = (o2->field_2).it, pcVar5 = o2, uVar2 == 0xfffffff5)) {
    pcVar5 = lj_meta_lookup(L,pcVar5,MM_le - ((op & 2U) == 0));
    uVar1 = (pcVar5->field_2).it;
    local_38 = pTVar9;
    if (uVar1 != 0xffffffff) {
      uVar8 = (ulong)L->base[-1].u32.lo;
      if (*(char *)(uVar8 + 6) == '\0') {
        pTVar9 = L->base + *(byte *)((ulong)*(uint *)(uVar8 + 0x10) - 0x39);
      }
      else {
        pTVar9 = L->top;
      }
      pcVar10 = lj_cont_condf;
      if ((op & 1U) == 0) {
        pcVar10 = lj_cont_condt;
      }
      pTVar9->u64 = (uint64_t)(pcVar10 + -0x10ad20);
      pTVar9[1] = *pcVar5;
      pTVar9[2] = *o1;
      pTVar9[3] = *o2;
      local_38 = pTVar9 + 2;
    }
    if (uVar1 == 0xffffffff) goto LAB_00117998;
  }
  else {
    local_38 = in_RAX;
    if (uVar1 == uVar2) {
      if (uVar2 == 0xfffffffb && uVar1 == 0xfffffffb) {
        uVar3 = lj_str_cmp((GCstr *)(ulong)(o1->u32).lo,(GCstr *)(ulong)(o2->u32).lo);
        uVar7 = (uint)((int)uVar3 < 1);
        if ((op & 2U) == 0) {
          uVar7 = uVar3 >> 0x1f;
        }
        return (TValue *)(ulong)(op & 1U ^ uVar7);
      }
    }
    else if (1 < (uVar2 + 3 | uVar1 + 3)) goto LAB_00117998;
    do {
      mm = MM_le - (((ulong)pTVar9 & 2) == 0);
      o1_00 = lj_meta_lookup(L,o1,mm);
      o2_00 = lj_meta_lookup(L,o2,mm);
      pcVar5 = o1;
      if (((o1_00->field_2).it == 0xffffffff) || (iVar4 = lj_obj_equal(o1_00,o2_00), iVar4 == 0)) {
        iVar4 = 2;
        if (((ulong)pTVar9 & 2) != 0) {
          pTVar9 = (TValue *)(ulong)((uint)pTVar9 ^ 3);
          iVar4 = 4;
          pcVar5 = o2;
          o2 = o1;
        }
      }
      else {
        uVar8 = (ulong)L->base[-1].u32.lo;
        if (*(char *)(uVar8 + 6) == '\0') {
          pTVar6 = L->base + *(byte *)((ulong)*(uint *)(uVar8 + 0x10) - 0x39);
        }
        else {
          pTVar6 = L->top;
        }
        pcVar10 = lj_cont_condf;
        if (((ulong)pTVar9 & 1) == 0) {
          pcVar10 = lj_cont_condt;
        }
        pTVar6->u64 = (uint64_t)(pcVar10 + -0x10ad20);
        local_38 = pTVar6 + 2;
        pTVar6[1] = *o1_00;
        pTVar6[2] = *o1;
        pTVar6[3] = *o2;
        iVar4 = 1;
      }
      o1 = pcVar5;
    } while (iVar4 == 4);
    if (iVar4 != 1) {
LAB_00117998:
      lj_err_comp(L,o1,o2);
    }
  }
  return local_38;
}

Assistant:

TValue *lj_meta_comp(lua_State *L, cTValue *o1, cTValue *o2, int op)
{
  if (LJ_HASFFI && (tviscdata(o1) || tviscdata(o2))) {
    ASMFunction cont = (op & 1) ? lj_cont_condf : lj_cont_condt;
    MMS mm = (op & 2) ? MM_le : MM_lt;
    cTValue *mo = lj_meta_lookup(L, tviscdata(o1) ? o1 : o2, mm);
    if (LJ_UNLIKELY(tvisnil(mo))) goto err;
    return mmcall(L, cont, mo, o1, o2);
  } else if (LJ_52 || itype(o1) == itype(o2)) {
    /* Never called with two numbers. */
    if (tvisstr(o1) && tvisstr(o2)) {
      int32_t res = lj_str_cmp(strV(o1), strV(o2));
      return (TValue *)(intptr_t)(((op&2) ? res <= 0 : res < 0) ^ (op&1));
    } else {
    trymt:
      while (1) {
	ASMFunction cont = (op & 1) ? lj_cont_condf : lj_cont_condt;
	MMS mm = (op & 2) ? MM_le : MM_lt;
	cTValue *mo = lj_meta_lookup(L, o1, mm);
#if LJ_52
	if (tvisnil(mo) && tvisnil((mo = lj_meta_lookup(L, o2, mm))))
#else
	cTValue *mo2 = lj_meta_lookup(L, o2, mm);
	if (tvisnil(mo) || !lj_obj_equal(mo, mo2))
#endif
	{
	  if (op & 2) {  /* MM_le not found: retry with MM_lt. */
	    cTValue *ot = o1; o1 = o2; o2 = ot;  /* Swap operands. */
	    op ^= 3;  /* Use LT and flip condition. */
	    continue;
	  }
	  goto err;
	}
	return mmcall(L, cont, mo, o1, o2);
      }
    }
  } else if (tvisbool(o1) && tvisbool(o2)) {
    goto trymt;
  } else {
  err:
    lj_err_comp(L, o1, o2);
    return NULL;
  }
}